

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
ProfiledGetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned,false,true,false>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  undefined4 *puVar4;
  Var value;
  
  propertyId = FunctionBody::GetPropertyIdFromCacheId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->inlineCacheIndex);
  bVar1 = playout->inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a7a63b;
    *puVar4 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) {
LAB_00a7a63b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  value = ProfilingHelpers::ProfiledLdFld<false,true,false>
                    (instance,propertyId,
                     *(InlineCache **)(*(long *)(this + 0x90) + (ulong)bVar1 * 8),
                     (uint)playout->inlineCacheIndex,*(FunctionBody **)(this + 0x88),instance);
  SetReg<unsigned_char>(this,playout->Value,value);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledGetProperty(unaligned T* playout, const Var instance)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = ProfilingHelpers::ProfiledLdFld<Root, Method, CallApplyTarget>(
            instance,
            propertyId,
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetFunctionBody(),
            instance);

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetRootValue throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful:*/true);
        }
#endif
    }